

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void MallocBlock::ProcessFreeQueue(MallocBlock *b,size_t size,int max_free_queue_size)

{
  PageID PVar1;
  bool bVar2;
  int32_t iVar3;
  FreeQueue<MallocBlockQueueEntry> *this;
  ulong uVar4;
  PageHeap *pPVar5;
  size_t sVar6;
  CentralFreeList *pCVar7;
  bool local_631;
  bool local_609;
  bool local_5f9;
  MallocBlockQueueEntry *local_5e0;
  int local_5d8;
  int local_5d4;
  int i_1;
  int i;
  undefined1 local_520 [8];
  MallocBlockQueueEntry new_entry;
  undefined1 local_478 [4];
  int num_entries;
  MallocBlockQueueEntry entries [4];
  int max_free_queue_size_local;
  size_t size_local;
  MallocBlock *b_local;
  Span *span;
  bool cache_hit;
  ulong uStack_1b8;
  uint32_t cl;
  PageID p;
  ThreadCache *heap;
  byte local_199;
  _func_void_void_ptr *local_198;
  void *local_190;
  uint local_184;
  long lStack_180;
  uint32_t idx;
  ThreadCache *local_178;
  SizeMap *local_170;
  undefined1 local_161;
  uint *local_160;
  ThreadCache *local_158;
  char local_149;
  ulong local_148;
  PageHeap *local_140;
  ulong local_138;
  Number i2;
  Number i1;
  PageMap *local_120;
  Span *local_118;
  Span *local_110;
  Span *span_1;
  bool cache_hit_1;
  ulong uStack_100;
  uint32_t cl_1;
  PageID p_1;
  ThreadCache *heap_1;
  byte local_e1;
  _func_void_void_ptr *local_e0;
  void *local_d8;
  uint local_cc;
  long lStack_c8;
  uint32_t idx_1;
  ThreadCache *local_c0;
  SizeMap *local_b8;
  undefined1 local_a9;
  uint *local_a8;
  ThreadCache *local_a0;
  char local_91;
  ulong local_90;
  PageHeap *local_88;
  ulong local_80;
  Number i2_1;
  Number i1_1;
  PageMap *local_68;
  Span *local_60;
  uint32_t local_54;
  FreeList *pFStack_50;
  uint32_t length_1;
  FreeList *list_1;
  void *local_40;
  PageID local_38;
  uint32_t local_2c;
  FreeList *pFStack_28;
  uint32_t length;
  FreeList *list;
  void *local_18;
  PageID local_10;
  
  local_5e0 = (MallocBlockQueueEntry *)local_478;
  do {
    MallocBlockQueueEntry::MallocBlockQueueEntry(local_5e0);
    local_5e0 = local_5e0 + 1;
  } while (local_5e0 != (MallocBlockQueueEntry *)&entries[3].deleter_threadid);
  new_entry.deleter_threadid._4_4_ = 0;
  MallocBlockQueueEntry::MallocBlockQueueEntry((MallocBlockQueueEntry *)local_520,b,size);
  SpinLock::Lock(&free_queue_lock_);
  if (free_queue_ == (FreeQueue<MallocBlockQueueEntry> *)0x0) {
    this = (FreeQueue<MallocBlockQueueEntry> *)operator_new(0x28008);
    FreeQueue<MallocBlockQueueEntry>::FreeQueue(this);
    free_queue_ = this;
  }
  bVar2 = FreeQueue<MallocBlockQueueEntry>::Full(free_queue_);
  if (bVar2) {
    syscall(1,2,"Check failed: !free_queue_->Full(): Free queue mustn\'t be full!\n",0x40);
    abort();
  }
  if (b != (MallocBlock *)0x0) {
    free_queue_size_ = size + 0xa0 + free_queue_size_;
    FreeQueue<MallocBlockQueueEntry>::Push(free_queue_,(MallocBlockQueueEntry *)local_520);
  }
  while( true ) {
    local_5f9 = true;
    if (free_queue_size_ <= (ulong)(long)max_free_queue_size) {
      local_5f9 = FreeQueue<MallocBlockQueueEntry>::Full(free_queue_);
    }
    if (local_5f9 == false) break;
    if (3 < new_entry.deleter_threadid._4_4_) {
      syscall(1,2,"Check failed: num_entries < arraysize(entries): entries array overflow\n",0x47);
      abort();
    }
    FreeQueue<MallocBlockQueueEntry>::Pop((MallocBlockQueueEntry *)&i_1,free_queue_);
    memcpy(local_478 + (long)(int)new_entry.deleter_threadid._4_4_ * 0xa0,&i_1,0xa0);
    free_queue_size_ =
         free_queue_size_ - (long)&entries[(int)new_entry.deleter_threadid._4_4_].block[3].magic1_;
    new_entry.deleter_threadid._4_4_ = new_entry.deleter_threadid._4_4_ + 1;
    if (new_entry.deleter_threadid._4_4_ == 4) {
      SpinLock::Unlock(&free_queue_lock_);
      for (local_5d4 = 0; local_5d4 < (int)new_entry.deleter_threadid._4_4_;
          local_5d4 = local_5d4 + 1) {
        CheckForDanglingWrites((MallocBlockQueueEntry *)(local_478 + (long)local_5d4 * 0xa0));
        local_190 = *(void **)(local_478 + (long)local_5d4 * 0xa0);
        local_198 = anon_unknown.dwarf_5601::InvalidFree;
        local_199 = 0;
        heap = (ThreadCache *)0x0;
        p = (PageID)tcmalloc::ThreadCachePtr::GetIfPresent();
        uStack_1b8 = (ulong)local_190 >> 0xd;
        if ((local_199 & 1) == 0) {
LAB_001275fc:
          local_609 = false;
          if ((local_199 & 1) == 0) {
            pPVar5 = tcmalloc::Static::pageheap();
            local_609 = tcmalloc::PageHeap::TryGetSizeClass
                                  (pPVar5,uStack_1b8,(uint32_t *)((long)&span + 4));
          }
          span._3_1_ = local_609;
          if (((local_609 ^ 0xffU) & 1) == 0) goto LAB_001277b8;
          local_140 = tcmalloc::Static::pageheap();
          local_148 = uStack_1b8;
          local_120 = &local_140->pagemap_;
          i1 = uStack_1b8;
          i2 = uStack_1b8 >> 0x12;
          local_138 = uStack_1b8 & 0x3ffff;
          if ((uStack_1b8 >> 0x23 == 0) && (local_120->root_[i2] != (Leaf *)0x0)) {
            local_118 = (Span *)local_120->root_[i2]->values[local_138];
          }
          else {
            local_118 = (Span *)0x0;
          }
          if (local_118 == (Span *)0x0) {
            anon_unknown.dwarf_5601::free_null_or_invalid(local_190,local_198);
          }
          else {
            span._4_4_ = *(uint *)&local_118->field_0x28 >> 0x10 & 0xff;
            if (span._4_4_ != 0) {
              if ((local_199 & 1) == 0) {
                pPVar5 = tcmalloc::Static::pageheap();
                tcmalloc::PageHeap::SetCachedSizeClass(pPVar5,uStack_1b8,span._4_4_);
              }
              goto LAB_001277b8;
            }
            anon_unknown.dwarf_5601::do_free_pages(local_118,local_190);
          }
        }
        else {
          local_170 = tcmalloc::Static::sizemap();
          local_178 = heap;
          lStack_180 = (long)&span + 4;
          local_158 = heap;
          local_160 = &local_184;
          if (heap < (ThreadCache *)0x401) {
            local_184 = (int)heap + 7U >> 3;
            local_149 = '\x01';
          }
          else if (heap < (ThreadCache *)0x40001) {
            local_184 = (int)heap + 0x3c7fU >> 7;
            local_149 = '\x01';
          }
          else {
            local_149 = '\0';
          }
          local_161 = local_149 != '\0';
          if (!(bool)local_161) goto LAB_001275fc;
          span._4_4_ = (uint)local_170->class_array_[local_184];
LAB_001277b8:
          PVar1 = p;
          if (p == 0) {
            bVar2 = tcmalloc::Static::IsInited();
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              tcmalloc::SLL_SetNext(local_190,(void *)0x0);
              pCVar7 = tcmalloc::Static::central_cache();
              tcmalloc::CentralFreeList::InsertRange(pCVar7 + span._4_4_,local_190,local_190,1);
            }
            else {
              anon_unknown.dwarf_5601::free_null_or_invalid(local_190,local_198);
            }
          }
          else {
            local_10 = p;
            local_18 = local_190;
            list._4_4_ = span._4_4_;
            pFStack_28 = (FreeList *)(p + (ulong)span._4_4_ * 0x20);
            local_2c = tcmalloc::ThreadCache::FreeList::Push(pFStack_28,local_190);
            uVar4 = (ulong)local_2c;
            sVar6 = tcmalloc::ThreadCache::FreeList::max_length(pFStack_28);
            if (sVar6 < uVar4) {
              tcmalloc::ThreadCache::ListTooLong((ThreadCache *)PVar1,pFStack_28,list._4_4_);
            }
            else {
              iVar3 = tcmalloc::ThreadCache::FreeList::object_size(pFStack_28);
              *(int32_t *)(PVar1 + 0x1000) = iVar3 + *(int *)(PVar1 + 0x1000);
              if (*(int *)(PVar1 + 0x1004) < *(int *)(PVar1 + 0x1000)) {
                tcmalloc::ThreadCache::Scavenge((ThreadCache *)PVar1);
              }
            }
          }
        }
      }
      new_entry.deleter_threadid._4_4_ = 0;
      SpinLock::Lock(&free_queue_lock_);
    }
  }
  SpinLock::Unlock(&free_queue_lock_);
  local_5d8 = 0;
  do {
    if ((int)new_entry.deleter_threadid._4_4_ <= local_5d8) {
      return;
    }
    CheckForDanglingWrites((MallocBlockQueueEntry *)(local_478 + (long)local_5d8 * 0xa0));
    local_d8 = *(void **)(local_478 + (long)local_5d8 * 0xa0);
    local_e0 = anon_unknown.dwarf_5601::InvalidFree;
    local_e1 = 0;
    heap_1 = (ThreadCache *)0x0;
    p_1 = (PageID)tcmalloc::ThreadCachePtr::GetIfPresent();
    uStack_100 = (ulong)local_d8 >> 0xd;
    if ((local_e1 & 1) == 0) {
LAB_00127aed:
      local_631 = false;
      if ((local_e1 & 1) == 0) {
        pPVar5 = tcmalloc::Static::pageheap();
        local_631 = tcmalloc::PageHeap::TryGetSizeClass
                              (pPVar5,uStack_100,(uint32_t *)((long)&span_1 + 4));
      }
      span_1._3_1_ = local_631;
      if (((local_631 ^ 0xffU) & 1) == 0) goto LAB_00127c79;
      local_88 = tcmalloc::Static::pageheap();
      local_90 = uStack_100;
      local_68 = &local_88->pagemap_;
      i1_1 = uStack_100;
      i2_1 = uStack_100 >> 0x12;
      local_80 = uStack_100 & 0x3ffff;
      if ((uStack_100 >> 0x23 == 0) && (local_68->root_[i2_1] != (Leaf *)0x0)) {
        local_60 = (Span *)local_68->root_[i2_1]->values[local_80];
      }
      else {
        local_60 = (Span *)0x0;
      }
      local_110 = local_60;
      if (local_60 == (Span *)0x0) {
        anon_unknown.dwarf_5601::free_null_or_invalid(local_d8,local_e0);
      }
      else {
        span_1._4_4_ = *(uint *)&local_60->field_0x28 >> 0x10 & 0xff;
        if (span_1._4_4_ != 0) {
          if ((local_e1 & 1) == 0) {
            pPVar5 = tcmalloc::Static::pageheap();
            tcmalloc::PageHeap::SetCachedSizeClass(pPVar5,uStack_100,span_1._4_4_);
          }
          goto LAB_00127c79;
        }
        anon_unknown.dwarf_5601::do_free_pages(local_60,local_d8);
      }
    }
    else {
      local_b8 = tcmalloc::Static::sizemap();
      local_c0 = heap_1;
      lStack_c8 = (long)&span_1 + 4;
      local_a0 = heap_1;
      local_a8 = &local_cc;
      if (heap_1 < (ThreadCache *)0x401) {
        local_cc = (int)heap_1 + 7U >> 3;
        local_91 = '\x01';
      }
      else if (heap_1 < (ThreadCache *)0x40001) {
        local_cc = (int)heap_1 + 0x3c7fU >> 7;
        local_91 = '\x01';
      }
      else {
        local_91 = '\0';
      }
      local_a9 = local_91 != '\0';
      if (!(bool)local_a9) goto LAB_00127aed;
      span_1._4_4_ = (uint)local_b8->class_array_[local_cc];
LAB_00127c79:
      PVar1 = p_1;
      if (p_1 == 0) {
        bVar2 = tcmalloc::Static::IsInited();
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          tcmalloc::SLL_SetNext(local_d8,(void *)0x0);
          pCVar7 = tcmalloc::Static::central_cache();
          tcmalloc::CentralFreeList::InsertRange(pCVar7 + span_1._4_4_,local_d8,local_d8,1);
        }
        else {
          anon_unknown.dwarf_5601::free_null_or_invalid(local_d8,local_e0);
        }
      }
      else {
        local_38 = p_1;
        local_40 = local_d8;
        list_1._4_4_ = span_1._4_4_;
        pFStack_50 = (FreeList *)(p_1 + (ulong)span_1._4_4_ * 0x20);
        local_54 = tcmalloc::ThreadCache::FreeList::Push(pFStack_50,local_d8);
        uVar4 = (ulong)local_54;
        sVar6 = tcmalloc::ThreadCache::FreeList::max_length(pFStack_50);
        if (sVar6 < uVar4) {
          tcmalloc::ThreadCache::ListTooLong((ThreadCache *)PVar1,pFStack_50,list_1._4_4_);
        }
        else {
          iVar3 = tcmalloc::ThreadCache::FreeList::object_size(pFStack_50);
          *(int32_t *)(PVar1 + 0x1000) = iVar3 + *(int *)(PVar1 + 0x1000);
          if (*(int *)(PVar1 + 0x1004) < *(int *)(PVar1 + 0x1000)) {
            tcmalloc::ThreadCache::Scavenge((ThreadCache *)PVar1);
          }
        }
      }
    }
    local_5d8 = local_5d8 + 1;
  } while( true );
}

Assistant:

static void ProcessFreeQueue(MallocBlock* b, size_t size,
                               int max_free_queue_size) {
    // MallocBlockQueueEntry are about 144 in size, so we can only
    // use a small array of them on the stack.
    MallocBlockQueueEntry entries[4];
    int num_entries = 0;
    MallocBlockQueueEntry new_entry(b, size);
    free_queue_lock_.Lock();
    if (free_queue_ == nullptr)
      free_queue_ = new FreeQueue<MallocBlockQueueEntry>;
    RAW_CHECK(!free_queue_->Full(), "Free queue mustn't be full!");

    if (b != nullptr) {
      free_queue_size_ += size + sizeof(MallocBlockQueueEntry);
      free_queue_->Push(new_entry);
    }

    // Free blocks until the total size of unfreed blocks no longer exceeds
    // max_free_queue_size, and the free queue has at least one free
    // space in it.
    while (free_queue_size_ > max_free_queue_size || free_queue_->Full()) {
      RAW_CHECK(num_entries < arraysize(entries), "entries array overflow");
      entries[num_entries] = free_queue_->Pop();
      free_queue_size_ -=
          entries[num_entries].size + sizeof(MallocBlockQueueEntry);
      num_entries++;
      if (num_entries == arraysize(entries)) {
        // The queue will not be full at this point, so it is ok to
        // release the lock.  The queue may still contain more than
        // max_free_queue_size, but this is not a strict invariant.
        free_queue_lock_.Unlock();
        for (int i = 0; i < num_entries; i++) {
          CheckForDanglingWrites(entries[i]);
          do_free(entries[i].block);
        }
        num_entries = 0;
        free_queue_lock_.Lock();
      }
    }
    free_queue_lock_.Unlock();
    for (int i = 0; i < num_entries; i++) {
      CheckForDanglingWrites(entries[i]);
      do_free(entries[i].block);
    }
  }